

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_message.hpp
# Opt level: O0

iuStreamMessage * __thiscall
iutest::detail::iuStreamMessage::operator<<(iuStreamMessage *this,FloatingPoint<long_double> *value)

{
  FloatingPoint<long_double> *in_RDX;
  string local_38;
  FloatingPoint<long_double> *local_18;
  FloatingPoint<long_double> *value_local;
  iuStreamMessage *this_local;
  
  local_18 = value;
  value_local = (FloatingPoint<long_double> *)this;
  PrintToString<iutest::internal::FloatingPoint<long_double>>(&local_38,(iutest *)value,in_RDX);
  std::operator<<((ostream *)&(this->m_stream).super_iu_stringstream.field_0x10,(string *)&local_38)
  ;
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

iuStreamMessage& operator << (const T& value)
    {
#if !defined(IUTEST_NO_ARGUMENT_DEPENDENT_LOOKUP)
        m_stream << PrintToString(value);
#else
        m_stream << value;
#endif
        return *this;
    }